

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_NestingIsLimitedWithoutCrashing_Test::
~ParseErrorTest_NestingIsLimitedWithoutCrashing_Test
          (ParseErrorTest_NestingIsLimitedWithoutCrashing_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseErrorTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_01937440;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseErrorTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseErrorTest).input_);
  pZVar1 = (this->super_ParseErrorTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseErrorTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseErrorTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseErrorTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, NestingIsLimitedWithoutCrashing) {
  std::string start = "syntax = \"proto2\";\n";
  std::string end;

  const auto add = [&] {
    absl::StrAppend(&start, "message M {");
    absl::StrAppend(&end, "}");
  };
  const auto input = [&] { return absl::StrCat(start, end); };

  // The first ones work correctly.
  for (int i = 1; i < internal::cpp::MaxMessageDeclarationNestingDepth(); ++i) {
    add();
    const std::string str = input();
    SetupParser(str);
    FileDescriptorProto proto;
    proto.set_name("foo.proto");
    EXPECT_TRUE(parser_->Parse(input_.get(), &proto)) << input();
    EXPECT_EQ(io::Tokenizer::TYPE_END, input_->current().type);
    ASSERT_EQ("", error_collector_.text_);
    DescriptorPool pool;
    ASSERT_TRUE(pool.BuildFile(proto));
  }
  // The rest have parsing errors but they don't crash no matter how deep we
  // make them.
  const auto error = testing::HasSubstr(
      "Reached maximum recursion limit for nested messages.");
  add();
  ExpectHasErrors(input(), error);
  for (int i = 0; i < 100000; ++i) {
    add();
  }
  ExpectHasErrors(input(), error);
}